

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_str_constraint.c
# Opt level: O2

constraint_handler_t set_str_constraint_handler_s(constraint_handler_t handler)

{
  constraint_handler_t p_Var1;
  long in_FS_OFFSET;
  
  if (handler == (constraint_handler_t)0x0) {
    handler = ignore_handler_s;
  }
  p_Var1 = str_handler;
  str_handler = handler;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return p_Var1;
  }
  __stack_chk_fail();
}

Assistant:

constraint_handler_t
set_str_constraint_handler_s (constraint_handler_t handler)
{
    constraint_handler_t prev_handler = str_handler;
    if (NULL == handler) {
        str_handler = sl_default_handler;
    } else {
        str_handler = handler;
    }
    return prev_handler;
}